

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O2

long __thiscall Jupiter::IRC::Client::readConfigLong(Client *this,string_view key,long defaultValue)

{
  long lVar1;
  string_view in_string;
  string_view sVar2;
  
  if (this->m_primary_section != (Config *)0x0) {
    sVar2 = Config::get(this->m_primary_section,key,(string_view)ZEXT816(0));
    in_string._M_str = sVar2._M_str;
    if ((Jupiter *)sVar2._M_len != (Jupiter *)0x0) {
      in_string._M_len = (size_t)in_string._M_str;
      lVar1 = from_string<long>((Jupiter *)sVar2._M_len,in_string);
      return lVar1;
    }
  }
  if (this->m_secondary_section != (Config *)0x0) {
    lVar1 = Config::get<long>(this->m_secondary_section,key,defaultValue);
    return lVar1;
  }
  return defaultValue;
}

Assistant:

long Jupiter::IRC::Client::readConfigLong(std::string_view key, long defaultValue) const {
	if (m_primary_section != nullptr) {
		std::string_view val = m_primary_section->get(key);

		if (!val.empty()) {
			return Jupiter::from_string<long>(val);
		}
	}

	if (m_secondary_section != nullptr)
		return m_secondary_section->get<long>(key, defaultValue);

	return defaultValue;
}